

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void __thiscall FFTAnalyzer::CheckInitialized(FFTAnalyzer *this)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  UnityComplexNumber *pUVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __n;
  long lVar9;
  float fVar10;
  
  if (this->window == (float *)0x0) {
    iVar1 = this->spectrumSize;
    uVar6 = (ulong)iVar1;
    __n = uVar6 * 4;
    uVar8 = __n;
    if ((long)uVar6 < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    uVar7 = uVar6 * 8;
    if ((long)uVar6 < 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pfVar3 = (float *)operator_new__(uVar8);
    this->window = pfVar3;
    pfVar3 = (float *)operator_new__(uVar8);
    this->ibuffer = pfVar3;
    pfVar4 = (float *)operator_new__(uVar8);
    uVar8 = (long)(iVar1 / 2) << 2;
    this->obuffer = pfVar4;
    if ((long)uVar6 < -1) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar4 = (float *)operator_new__(uVar8);
    this->ispec1 = pfVar4;
    pfVar4 = (float *)operator_new__(uVar8);
    this->ispec2 = pfVar4;
    pfVar4 = (float *)operator_new__(uVar8);
    this->ospec1 = pfVar4;
    pfVar4 = (float *)operator_new__(uVar8);
    this->ospec2 = pfVar4;
    pUVar5 = (UnityComplexNumber *)operator_new__(uVar7);
    this->cspec = pUVar5;
    if (0 < (long)uVar6) {
      lVar9 = 0;
      do {
        fVar10 = cosf((3.1415927 / (float)(int)uVar6) * (float)(int)lVar9);
        this->window[lVar9] = fVar10 * -0.46 + 0.54;
        lVar9 = lVar9 + 1;
        uVar2 = this->spectrumSize;
        uVar6 = (ulong)uVar2;
      } while (lVar9 < (int)uVar2);
      pfVar3 = this->ibuffer;
      __n = (long)(int)uVar2 << 2;
    }
    memset(pfVar3,0,__n);
    memset(this->obuffer,0,(long)this->spectrumSize << 2);
    memset(this->ispec1,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ispec2,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ospec1,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ospec2,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->cspec,0,(long)this->spectrumSize << 3);
    return;
  }
  return;
}

Assistant:

void FFTAnalyzer::CheckInitialized()
{
    if (window == NULL)
    {
        window = new float[spectrumSize];
        ibuffer = new float[spectrumSize];
        obuffer = new float[spectrumSize];
        ispec1 = new float[spectrumSize / 2];
        ispec2 = new float[spectrumSize / 2];
        ospec1 = new float[spectrumSize / 2];
        ospec2 = new float[spectrumSize / 2];
        cspec = new UnityComplexNumber[spectrumSize];
        for (int n = 0; n < spectrumSize; n++)
            window[n] = 0.54f - 0.46f * cosf(n * (kPI / (float)spectrumSize));
        memset(ibuffer, 0, sizeof(float) * spectrumSize);
        memset(obuffer, 0, sizeof(float) * spectrumSize);
        memset(ispec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ispec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(cspec, 0, sizeof(UnityComplexNumber) * spectrumSize);
    }
}